

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O2

void __thiscall
fizplex::BaseTestRegularWithReordering_BaseMatrixTimesInverseIsIdentity_Test::TestBody
          (BaseTestRegularWithReordering_BaseMatrixTimesInverseIsIdentity_Test *this)

{
  ColMatrix *rhs;
  char *pcVar1;
  AssertionResult gtest_ar;
  ColMatrix local_80;
  ColMatrix local_58;
  ColMatrix inv;
  
  Base::get_inverse(&inv,&(this->super_BaseTestRegularWithReordering).b);
  ColMatrix::identity(&local_58,3);
  rhs = &(this->super_BaseTestRegularWithReordering).m;
  ColMatrix::operator*(&local_80,&inv,rhs);
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&gtest_ar,"ColMatrix::identity(3)","inv * m",&local_58,&local_80);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_80.cols);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_58.cols);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x7e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ColMatrix::identity(&local_58,3);
  ColMatrix::operator*(&local_80,rhs,&inv);
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&gtest_ar,"ColMatrix::identity(3)","m * inv",&local_58,&local_80);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_80.cols);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_58.cols);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&inv.cols);
  return;
}

Assistant:

TEST_F(BaseTestRegularWithReordering, BaseMatrixTimesInverseIsIdentity) {
  const auto inv = b.get_inverse();
  EXPECT_EQ(ColMatrix::identity(3), inv * m);
  EXPECT_EQ(ColMatrix::identity(3), m * inv);
}